

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarEnv.cpp
# Opt level: O2

void __thiscall VarEnv::assignVar(VarEnv *this,string *name,Data *data)

{
  iterator iVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>
  pStack_48;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Data_*>_>_>
                  *)this,name);
  Data::cite(data);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->vars)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string((string *)&pStack_48,(string *)name);
    pStack_48.second = data;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Data*>,std::_Select1st<std::pair<std::__cxx11::string_const,Data*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Data*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Data*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Data*>,std::_Select1st<std::pair<std::__cxx11::string_const,Data*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Data*>>>
                *)this,&pStack_48);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  else {
    Data::uncite(*(Data **)(iVar1._M_node + 2));
    Data::check(*(Data **)(iVar1._M_node + 2));
    *(Data **)(iVar1._M_node + 2) = data;
  }
  return;
}

Assistant:

void VarEnv::assignVar(const std::string &name, Data *data) {
    auto search = vars.find(name);
    data->cite();
    if (search != vars.end()) {
        (search->second)->uncite();
        Data::check(search->second);
        search->second = data;
    } else {
        vars.insert(std::pair<std::string, Data *>(name, data));
    }
}